

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

double __thiscall
helics::RandomDropFilterOperation::getProperty(RandomDropFilterOperation *this,string_view property)

{
  string_view sVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar2;
  char *in_RDX;
  char *in_RSI;
  FilterOperations *in_RDI;
  double dVar3;
  char *in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  char *pcVar4;
  size_t in_stack_ffffffffffffffb8;
  char *pcVar5;
  char *in_stack_ffffffffffffffc0;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  __x._M_str = in_stack_ffffffffffffffc0;
  __x._M_len = in_stack_ffffffffffffffb8;
  __y._M_str = in_stack_ffffffffffffffb0;
  __y._M_len = in_stack_ffffffffffffffa8;
  bVar2 = std::operator==(__x,__y);
  if (!bVar2) {
    pcVar4 = in_RSI;
    pcVar5 = in_RDX;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    __x_00._M_str = in_stack_ffffffffffffffc0;
    __x_00._M_len = (size_t)pcVar5;
    __y_00._M_str = pcVar4;
    __y_00._M_len = in_stack_ffffffffffffffa8;
    bVar2 = std::operator==(__x_00,__y_00);
    if (!bVar2) {
      sVar1._M_str = in_RDX;
      sVar1._M_len = (size_t)in_RSI;
      dVar3 = FilterOperations::getProperty(in_RDI,sVar1);
      return dVar3;
    }
  }
  dVar3 = std::__atomic_float<double>::load((__atomic_float<double> *)(in_RDI + 1),seq_cst);
  return dVar3;
}

Assistant:

double RandomDropFilterOperation::getProperty(std::string_view property)
{
    if ((property == "dropprob") || (property == "prob")) {
        return dropProb.load();
    }
    return FilterOperations::getProperty(property);
}